

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenArraySetSetRef(BinaryenExpressionRef expr,BinaryenExpressionRef refExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef refExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::ArraySet>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<ArraySet>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x1128,
                  "void BinaryenArraySetSetRef(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (refExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = refExpr;
    return;
  }
  __assert_fail("refExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x1129,"void BinaryenArraySetSetRef(BinaryenExpressionRef, BinaryenExpressionRef)")
  ;
}

Assistant:

void BinaryenArraySetSetRef(BinaryenExpressionRef expr,
                            BinaryenExpressionRef refExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArraySet>());
  assert(refExpr);
  static_cast<ArraySet*>(expression)->ref = (Expression*)refExpr;
}